

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall NaPNStatistics::relate_connectors(NaPNStatistics *this)

{
  NaVector *pNVar1;
  long in_RDI;
  int n;
  int id;
  uint local_10;
  int local_c;
  
  local_10 = 0;
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    if ((*(uint *)(in_RDI + 0x188) & 1 << ((byte)local_c & 0x1f)) != 0) {
      local_10 = local_10 + 1;
    }
  }
  pNVar1 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x90));
  (*pNVar1->_vptr_NaVector[4])(pNVar1,(ulong)local_10);
  return;
}

Assistant:

void
NaPNStatistics::relate_connectors ()
{
    // n - number of needed statistics
    int	id, n = 0;
    for(id = 0; id < NaSI_number; ++id){
      if(mOutStat & NaSIdToMask(id))
	++n;
    }
    stat.data().new_dim(n);
}